

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void boundaryPM(BPMLists *lists,BPMNode *leaves,size_t numpresent,int c,int num)

{
  uint index;
  BPMNode *pBVar1;
  ulong uVar2;
  long lVar3;
  int weight;
  long lVar4;
  
  lVar4 = (long)c;
  lVar3 = 0;
  while( true ) {
    pBVar1 = lists->chains1[lVar4 + lVar3];
    index = pBVar1->index;
    uVar2 = (ulong)index;
    if (-lVar4 == lVar3) {
      if (uVar2 < numpresent) {
        *lists->chains0 = pBVar1;
        pBVar1 = bpmnode_create(lists,leaves[uVar2].weight,index + 1,(BPMNode *)0x0);
        *lists->chains1 = pBVar1;
      }
      return;
    }
    weight = lists->chains1[lVar4 + lVar3 + -1]->weight + lists->chains0[lVar4 + lVar3 + -1]->weight
    ;
    lists->chains0[lVar4 + lVar3] = pBVar1;
    if ((uVar2 < numpresent) && (leaves[uVar2].weight < weight)) break;
    pBVar1 = bpmnode_create(lists,weight,index,lists->chains1[lVar4 + lVar3 + -1]);
    lists->chains1[lVar4 + lVar3] = pBVar1;
    if ((int)numpresent * 2 + -2 <= num + 1) {
      return;
    }
    boundaryPM(lists,leaves,numpresent,c + -1 + (int)lVar3,num);
    lVar3 = lVar3 + -1;
  }
  pBVar1 = bpmnode_create(lists,leaves[uVar2].weight,index + 1,lists->chains1[lVar4 + lVar3]->tail);
  lists->chains1[lVar4 + lVar3] = pBVar1;
  return;
}

Assistant:

static void boundaryPM(BPMLists* lists, BPMNode* leaves, size_t numpresent, int c, int num)
{
  unsigned lastindex = lists->chains1[c]->index;

  if(c == 0)
  {
    if(lastindex >= numpresent) return;
    lists->chains0[c] = lists->chains1[c];
    lists->chains1[c] = bpmnode_create(lists, leaves[lastindex].weight, lastindex + 1, 0);
  }
  else
  {
    /*sum of the weights of the head nodes of the previous lookahead chains.*/
    int sum = lists->chains0[c - 1]->weight + lists->chains1[c - 1]->weight;
    lists->chains0[c] = lists->chains1[c];
    if(lastindex < numpresent && sum > leaves[lastindex].weight)
    {
      lists->chains1[c] = bpmnode_create(lists, leaves[lastindex].weight, lastindex + 1, lists->chains1[c]->tail);
      return;
    }
    lists->chains1[c] = bpmnode_create(lists, sum, lastindex, lists->chains1[c - 1]);
    /*in the end we are only interested in the chain of the last list, so no
    need to recurse if we're at the last one (this gives measurable speedup)*/
    if(num + 1 < (int)(2 * numpresent - 2))
    {
      boundaryPM(lists, leaves, numpresent, c - 1, num);
      boundaryPM(lists, leaves, numpresent, c - 1, num);
    }
  }
}